

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

void __thiscall ot::commissioner::coap::Coap::ResponsesCache::Eliminate(ResponsesCache *this)

{
  const_iterator __position;
  long lVar1;
  char *pcVar2;
  byte bVar3;
  long lVar4;
  ByteArray *aBytes;
  char *from;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *to;
  bool bVar5;
  string_view fmt;
  format_args args;
  writer write;
  string local_f8;
  undefined1 local_d8 [32];
  string local_b8;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  void *local_48 [3];
  
  lVar4 = std::chrono::_V2::system_clock::now();
  if ((this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    while( true ) {
      __position._M_node = (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      lVar1 = *(long *)(__position._M_node + 1);
      if (lVar4 < lVar1) break;
      std::
      _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>,_std::_Select1st<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>_>
      ::_M_erase_aux(&(this->mContainer)._M_t,__position);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"coap","");
      local_98.types_[0] = pointer_type;
      local_98.types_[1] = string_type;
      local_98.types_[2] = uint_type;
      from = "server(={}) remove response cache: token={}, messageId={}";
      local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "server(={}) remove response cache: token={}, messageId={}";
      local_98.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x39;
      local_98.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_98.context_.super_basic_format_parse_context<char>._20_4_ = 3;
      local_98.parse_funcs_[2] =
           ::fmt::v10::detail::
           parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
      local_98.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      local_98.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_d8._0_8_ = &local_98;
      local_98.context_.types_ = local_98.types_;
      do {
        if (from == "") break;
        to = from;
        if (*from == '{') {
LAB_001d7e59:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
          ::writer::operator()((writer *)local_d8,from,to);
          from = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string,unsigned_short>&>
                           (to,"",&local_98);
          bVar5 = true;
        }
        else {
          to = from + 1;
          bVar5 = to != "";
          if (bVar5) {
            if (*to != '{') {
              pcVar2 = from + 2;
              do {
                to = pcVar2;
                bVar5 = to != "";
                if (to == "") goto LAB_001d7e55;
                pcVar2 = to + 1;
              } while (*to != '{');
            }
            bVar5 = true;
          }
LAB_001d7e55:
          if (bVar5) goto LAB_001d7e59;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
          ::writer::operator()((writer *)local_d8,from,"");
          bVar5 = false;
        }
      } while (bVar5);
      bVar3 = *(byte *)&__position._M_node[1]._M_parent >> 4;
      if (7 < bVar3) {
        bVar3 = 8;
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_48,
                 (uchar *)((long)&__position._M_node[1]._M_parent + 4),
                 (uchar *)((long)&__position._M_node[1]._M_parent + (ulong)bVar3 + 4),
                 (allocator_type *)&local_98);
      utils::Hex_abi_cxx11_((string *)local_d8,(utils *)local_48,aBytes);
      local_98.context_.super_basic_format_parse_context<char>._16_8_ =
           ZEXT28(*(ushort *)((long)&__position._M_node[1]._M_parent + 2));
      local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)local_d8._0_8_;
      local_98.context_.super_basic_format_parse_context<char>.format_str_.size_ = local_d8._8_8_;
      fmt.size_ = 0x2de;
      fmt.data_ = (char *)0x39;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_98;
      local_98.types_._0_8_ = this;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"server(={}) remove response cache: token={}, messageId={}",fmt,
                 args);
      Log(kInfo,&local_f8,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_d8._0_8_ !=
          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
      if (local_48[0] != (void *)0x0) {
        operator_delete(local_48[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (lVar4 < lVar1) {
        return;
      }
      if ((this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

void Coap::ResponsesCache::Eliminate()
{
    auto now = Clock::now();

    while (!mContainer.empty())
    {
        auto  earliest = mContainer.begin();
        auto  deadTime = earliest->first;
        auto &response = earliest->second;
        if (deadTime > now)
        {
            break;
        }
        mContainer.erase(earliest);
        LOG_INFO(LOG_REGION_COAP, "server(={}) remove response cache: token={}, messageId={}",
                 static_cast<void *>(this), utils::Hex(response.GetToken()), response.GetMessageId());
    }
}